

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

QPDFMatrix * __thiscall
QPDFPageObjectHelper::getMatrixForFormXObjectPlacement
          (QPDFMatrix *__return_storage_ptr__,QPDFPageObjectHelper *this,QPDFObjectHandle *fo,
          Rectangle rect,bool invert_transformations,bool allow_shrink,bool allow_expand)

{
  Rectangle r;
  Rectangle r_00;
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  allocator<char> local_1d9;
  Rectangle T;
  QPDFMatrix local_1b8;
  QPDFObjectHandle fdict;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  QPDFObjectHandle bbox_obj;
  Rectangle bbox;
  QPDFMatrix wmatrix;
  QPDFObjectHandle local_f8;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  QPDFMatrix tmatrix;
  QPDFMatrix fmatrix;
  
  QPDFObjectHandle::getDict(&fdict);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wmatrix,"/BBox",(allocator<char> *)&tmatrix);
  QPDFObjectHandle::getKey(&bbox_obj,(string *)&fdict);
  std::__cxx11::string::~string((string *)&wmatrix);
  bVar1 = QPDFObjectHandle::isRectangle(&bbox_obj);
  if (!bVar1) {
    QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
    goto LAB_001a8b08;
  }
  QPDFMatrix::QPDFMatrix(&wmatrix);
  QPDFMatrix::QPDFMatrix(&tmatrix);
  QPDFMatrix::QPDFMatrix(&fmatrix);
  if (invert_transformations) {
    getMatrixForTransformations((Matrix *)&bbox,this,true);
    QPDFMatrix::QPDFMatrix(&local_1b8,(Matrix *)&bbox);
    tmatrix.e = local_1b8.e;
    tmatrix.f = local_1b8.f;
    tmatrix.c = local_1b8.c;
    tmatrix.d = local_1b8.d;
    tmatrix.a = local_1b8.a;
    tmatrix.b = local_1b8.b;
    QPDFMatrix::concat(&wmatrix,&tmatrix);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"/Matrix",(allocator<char> *)&T);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&bbox,(string *)&fdict);
  bVar1 = QPDFObjectHandle::isMatrix((QPDFObjectHandle *)&bbox);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bbox.lly);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&T,"/Matrix",&local_1d9);
    QPDFObjectHandle::getKey(&local_f8,(string *)&fdict);
    QPDFObjectHandle::getArrayAsMatrix((Matrix *)&bbox,&local_f8);
    QPDFMatrix::QPDFMatrix(&local_1b8,(Matrix *)&bbox);
    fmatrix.e = local_1b8.e;
    fmatrix.f = local_1b8.f;
    fmatrix.c = local_1b8.c;
    fmatrix.d = local_1b8.d;
    fmatrix.a = local_1b8.a;
    fmatrix.b = local_1b8.b;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_f8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&T);
    QPDFMatrix::concat(&wmatrix,&fmatrix);
  }
  QPDFObjectHandle::getArrayAsRectangle(&bbox,&bbox_obj);
  r.lly = bbox.lly;
  r.llx = bbox.llx;
  r.urx = bbox.urx;
  r.ury = bbox.ury;
  QPDFMatrix::transformRectangle(&T,&wmatrix,r);
  if (((T.urx == T.llx) && (!NAN(T.urx) && !NAN(T.llx))) ||
     ((T.ury == T.lly && (!NAN(T.ury) && !NAN(T.lly))))) {
    QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
    goto LAB_001a8b08;
  }
  local_a8 = rect.urx;
  dStack_a0 = rect.ury;
  local_98 = rect.llx;
  dStack_90 = rect.lly;
  auVar2._0_8_ = rect.urx - rect.llx;
  auVar2._8_8_ = rect.ury - rect.lly;
  auVar3._8_4_ = SUB84(T.ury - T.lly,0);
  auVar3._0_8_ = T.urx - T.llx;
  auVar3._12_4_ = (int)((ulong)(T.ury - T.lly) >> 0x20);
  auVar3 = divpd(auVar2,auVar3);
  local_178._M_allocated_capacity = (size_type)auVar3._0_8_;
  if (auVar3._8_8_ <= auVar3._0_8_) {
    local_178._M_allocated_capacity = (size_type)auVar3._8_8_;
  }
  if ((double)local_178._M_allocated_capacity <= 1.0) {
    if ((double)local_178._M_allocated_capacity < 1.0 && !allow_shrink) goto LAB_001a8bae;
  }
  else if (!allow_expand) {
LAB_001a8bae:
    local_178._M_allocated_capacity = 0x3ff0000000000000;
  }
  QPDFMatrix::QPDFMatrix(&local_1b8);
  wmatrix.e = local_1b8.e;
  wmatrix.f = local_1b8.f;
  wmatrix.c = local_1b8.c;
  wmatrix.d = local_1b8.d;
  wmatrix.a = local_1b8.a;
  wmatrix.b = local_1b8.b;
  QPDFMatrix::scale(&wmatrix,(double)local_178._M_allocated_capacity,(double)local_178._0_8_);
  QPDFMatrix::concat(&wmatrix,&tmatrix);
  QPDFMatrix::concat(&wmatrix,&fmatrix);
  r_00.lly = bbox.lly;
  r_00.llx = bbox.llx;
  r_00.urx = bbox.urx;
  r_00.ury = bbox.ury;
  QPDFMatrix::transformRectangle((Rectangle *)&local_1b8,&wmatrix,r_00);
  T.urx = local_1b8.c;
  T.ury = local_1b8.d;
  T.llx = local_1b8.a;
  T.lly = local_1b8.b;
  local_b8 = local_1b8.a;
  uStack_b0 = 0;
  local_d8 = local_1b8.b;
  uStack_d0 = 0;
  local_c8 = local_1b8.c;
  uStack_c0 = 0;
  local_e8 = local_1b8.d;
  uStack_e0 = 0;
  QPDFMatrix::QPDFMatrix(__return_storage_ptr__);
  QPDFMatrix::translate
            (__return_storage_ptr__,(local_98 + local_a8) * 0.5 - (local_c8 + local_b8) * 0.5,
             (dStack_90 + dStack_a0) * 0.5 - (local_e8 + local_d8) * 0.5);
  QPDFMatrix::scale(__return_storage_ptr__,(double)local_178._M_allocated_capacity,
                    (double)local_178._0_8_);
  QPDFMatrix::concat(__return_storage_ptr__,&tmatrix);
LAB_001a8b08:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bbox_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fdict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

QPDFMatrix
QPDFPageObjectHelper::getMatrixForFormXObjectPlacement(
    QPDFObjectHandle fo,
    QPDFObjectHandle::Rectangle rect,
    bool invert_transformations,
    bool allow_shrink,
    bool allow_expand)
{
    // Calculate the transformation matrix that will place the given form XObject fully inside the
    // given rectangle, center and shrinking or expanding as needed if requested.

    // When rendering a form XObject, the transformation in the graphics state (cm) is applied first
    // (of course -- when it is applied, the PDF interpreter doesn't even know we're going to be
    // drawing a form XObject yet), and then the object's matrix (M) is applied. The resulting
    // matrix, when applied to the form XObject's bounding box, will generate a new rectangle. We
    // want to create a transformation matrix that make the form XObject's bounding box land in
    // exactly the right spot.

    QPDFObjectHandle fdict = fo.getDict();
    QPDFObjectHandle bbox_obj = fdict.getKey("/BBox");
    if (!bbox_obj.isRectangle()) {
        return {};
    }

    QPDFMatrix wmatrix; // work matrix
    QPDFMatrix tmatrix; // "to" matrix
    QPDFMatrix fmatrix; // "from" matrix
    if (invert_transformations) {
        // tmatrix inverts scaling and rotation of the destination page. Applying this matrix allows
        // the overlaid form XObject's to be absolute rather than relative to properties of the
        // destination page. tmatrix is part of the computed transformation matrix.
        tmatrix = QPDFMatrix(getMatrixForTransformations(true));
        wmatrix.concat(tmatrix);
    }
    if (fdict.getKey("/Matrix").isMatrix()) {
        // fmatrix is the transformation matrix that is applied to the form XObject itself. We need
        // this for calculations, but we don't explicitly use it in the final result because the PDF
        // rendering system automatically applies this last before
        // drawing the form XObject.
        fmatrix = QPDFMatrix(fdict.getKey("/Matrix").getArrayAsMatrix());
        wmatrix.concat(fmatrix);
    }

    // The current wmatrix handles transformation from the form xobject and, if requested, the
    // destination page. Next, we have to adjust this for scale and position.

    // Step 1: figure out what scale factor we need to make the form XObject's bounding box fit
    // within the destination rectangle.

    // Transform bounding box
    QPDFObjectHandle::Rectangle bbox = bbox_obj.getArrayAsRectangle();
    QPDFObjectHandle::Rectangle T = wmatrix.transformRectangle(bbox);

    // Calculate a scale factor, if needed. Shrink or expand if needed and allowed.
    if ((T.urx == T.llx) || (T.ury == T.lly)) {
        // avoid division by zero
        return {};
    }
    double rect_w = rect.urx - rect.llx;
    double rect_h = rect.ury - rect.lly;
    double t_w = T.urx - T.llx;
    double t_h = T.ury - T.lly;
    double xscale = rect_w / t_w;
    double yscale = rect_h / t_h;
    double scale = (xscale < yscale ? xscale : yscale);
    if (scale > 1.0) {
        if (!allow_expand) {
            scale = 1.0;
        }
    } else if (scale < 1.0) {
        if (!allow_shrink) {
            scale = 1.0;
        }
    }

    // Step 2: figure out what translation is required to get the rectangle to the right spot:
    // centered within the destination.
    wmatrix = QPDFMatrix();
    wmatrix.scale(scale, scale);
    wmatrix.concat(tmatrix);
    wmatrix.concat(fmatrix);

    T = wmatrix.transformRectangle(bbox);
    double t_cx = (T.llx + T.urx) / 2.0;
    double t_cy = (T.lly + T.ury) / 2.0;
    double r_cx = (rect.llx + rect.urx) / 2.0;
    double r_cy = (rect.lly + rect.ury) / 2.0;
    double tx = r_cx - t_cx;
    double ty = r_cy - t_cy;

    // Now we can calculate the final matrix. The final matrix does not include fmatrix because that
    // is applied automatically by the PDF interpreter.
    QPDFMatrix cm;
    cm.translate(tx, ty);
    cm.scale(scale, scale);
    cm.concat(tmatrix);
    return cm;
}